

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

void luaH_resize(lua_State *L,Table *t,uint newasize,uint nhsize)

{
  uint uVar1;
  TValue *pTVar2;
  TValue *newarray;
  undefined1 local_60 [4];
  uint oldasize;
  Table newt;
  uint i;
  uint nhsize_local;
  uint newasize_local;
  Table *t_local;
  lua_State *L_local;
  
  uVar1 = setlimittosize(t);
  setnodevector(L,(Table *)local_60,nhsize);
  if (newasize < uVar1) {
    t->alimit = newasize;
    exchangehashpart(t,(Table *)local_60);
    for (newt.gclist._4_4_ = newasize; newt.gclist._4_4_ < uVar1;
        newt.gclist._4_4_ = newt.gclist._4_4_ + 1) {
      if ((t->array[newt.gclist._4_4_].tt_ & 0xf) != 0) {
        luaH_setint(L,t,(ulong)(newt.gclist._4_4_ + 1),t->array + newt.gclist._4_4_);
      }
    }
    t->alimit = uVar1;
    exchangehashpart(t,(Table *)local_60);
  }
  pTVar2 = (TValue *)luaM_realloc_(L,t->array,(ulong)uVar1 << 4,(ulong)newasize << 4);
  if (pTVar2 == (TValue *)0x0 && newasize != 0) {
    freehash(L,(Table *)local_60);
    luaD_throw(L,4);
  }
  exchangehashpart(t,(Table *)local_60);
  t->array = pTVar2;
  t->alimit = newasize;
  for (newt.gclist._4_4_ = uVar1; newt.gclist._4_4_ < newasize;
      newt.gclist._4_4_ = newt.gclist._4_4_ + 1) {
    t->array[newt.gclist._4_4_].tt_ = '\x10';
  }
  reinsert(L,(Table *)local_60,t);
  freehash(L,(Table *)local_60);
  return;
}

Assistant:

void luaH_resize (lua_State *L, Table *t, unsigned int newasize,
                                          unsigned int nhsize) {
  unsigned int i;
  Table newt;  /* to keep the new hash part */
  unsigned int oldasize = setlimittosize(t);
  TValue *newarray;
  /* create new hash part with appropriate size into 'newt' */
  setnodevector(L, &newt, nhsize);
  if (newasize < oldasize) {  /* will array shrink? */
    t->alimit = newasize;  /* pretend array has new size... */
    exchangehashpart(t, &newt);  /* and new hash */
    /* re-insert into the new hash the elements from vanishing slice */
    for (i = newasize; i < oldasize; i++) {
      if (!isempty(&t->array[i]))
        luaH_setint(L, t, i + 1, &t->array[i]);
    }
    t->alimit = oldasize;  /* restore current size... */
    exchangehashpart(t, &newt);  /* and hash (in case of errors) */
  }
  /* allocate new array */
  newarray = luaM_reallocvector(L, t->array, oldasize, newasize, TValue);
  if (l_unlikely(newarray == NULL && newasize > 0)) {  /* allocation failed? */
    freehash(L, &newt);  /* release new hash part */
    luaM_error(L);  /* raise error (with array unchanged) */
  }
  /* allocation ok; initialize new part of the array */
  exchangehashpart(t, &newt);  /* 't' has the new hash ('newt' has the old) */
  t->array = newarray;  /* set new array part */
  t->alimit = newasize;
  for (i = oldasize; i < newasize; i++)  /* clear new slice of the array */
     setempty(&t->array[i]);
  /* re-insert elements from old hash part into new parts */
  reinsert(L, &newt, t);  /* 'newt' now has the old hash */
  freehash(L, &newt);  /* free old hash part */
}